

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbagePointSet
          (SceneGraph *this,int hash,size_t numPoints,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  size_t sVar4;
  ulong uVar5;
  Vec3fx *pVVar6;
  undefined8 uVar7;
  ulong uVar8;
  Node *pNVar9;
  uint uVar10;
  int iVar11;
  PointSetNode *this_00;
  Vec3fx *pVVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  Ref<embree::SceneGraph::MaterialNode> local_48;
  size_t local_40;
  Node *local_38;
  
  local_40 = numPoints;
  this_00 = (PointSetNode *)operator_new(0xb0);
  local_48 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  PointSetNode::PointSetNode
            (this_00,RTC_GEOMETRY_TYPE_SPHERE_POINT,&local_48,(BBox1f)0x3f80000000000000,
             (ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_38 = (Node *)this;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (local_40 != 0) {
    uVar10 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar10 = (uVar10 * -0x194da000 | uVar10 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar10 = uVar10 >> 0x10 ^ uVar10;
    sVar18 = 0;
    do {
      pvVar3 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = pvVar3->size_active;
      uVar5 = pvVar3->size_alloced;
      uVar15 = sVar4 + 1;
      uVar17 = uVar5;
      if ((uVar5 < uVar15) && (uVar17 = uVar15, uVar8 = uVar5, uVar5 != 0)) {
        for (; uVar17 = uVar8, uVar8 < uVar15; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0)) {
        }
      }
      if (uVar5 != uVar17) {
        pVVar6 = pvVar3->items;
        pVVar12 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
        pvVar3->items = pVVar12;
        if (pvVar3->size_active != 0) {
          lVar13 = 0;
          uVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)&pVVar6->field_0 + lVar13);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            uVar15 = uVar15 + 1;
            lVar13 = lVar13 + 0x10;
          } while (uVar15 < pvVar3->size_active);
        }
        alignedFree(pVVar6);
        pvVar3->size_active = sVar4;
        pvVar3->size_alloced = uVar17;
      }
      iVar11 = uVar10 * 0x19660d;
      iVar14 = uVar10 * 0x17385ca9;
      iVar16 = uVar10 * -0x50b6f56b;
      uVar10 = uVar10 * 0x979e791 + 0xaaf95334;
      sVar4 = pvVar3->size_active;
      pVVar6 = pvVar3->items;
      pvVar3->size_active = sVar4 + 1;
      *(ulong *)&pVVar6[sVar4].field_0 = CONCAT44(iVar14 + 0x47502932,iVar11 + 0x3c6ef35f);
      *(ulong *)((long)&pVVar6[sVar4].field_0 + 8) = CONCAT44(uVar10,iVar16 + -0x2e330917);
      if (mblur) {
        pvVar3 = (this_00->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar4 = pvVar3[1].size_active;
        uVar5 = pvVar3[1].size_alloced;
        uVar15 = sVar4 + 1;
        uVar17 = uVar5;
        if ((uVar5 < uVar15) && (uVar17 = uVar15, uVar8 = uVar5, uVar5 != 0)) {
          for (; uVar17 = uVar8, uVar8 < uVar15; uVar8 = uVar8 * 2 + (ulong)(uVar8 * 2 == 0)) {
          }
        }
        if (uVar5 != uVar17) {
          pVVar6 = pvVar3[1].items;
          pVVar12 = (Vec3fx *)alignedMalloc(uVar17 << 4,0x10);
          pvVar3[1].items = pVVar12;
          if (pvVar3[1].size_active != 0) {
            lVar13 = 0;
            uVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)&pVVar6->field_0 + lVar13);
              uVar7 = puVar1[1];
              puVar2 = (undefined8 *)((long)&(pvVar3[1].items)->field_0 + lVar13);
              *puVar2 = *puVar1;
              puVar2[1] = uVar7;
              uVar15 = uVar15 + 1;
              lVar13 = lVar13 + 0x10;
            } while (uVar15 < pvVar3[1].size_active);
          }
          alignedFree(pVVar6);
          pvVar3[1].size_active = sVar4;
          pvVar3[1].size_alloced = uVar17;
        }
        iVar11 = uVar10 * 0x19660d;
        iVar14 = uVar10 * 0x17385ca9;
        iVar16 = uVar10 * -0x50b6f56b;
        uVar10 = uVar10 * 0x979e791 + 0xaaf95334;
        sVar4 = pvVar3[1].size_active;
        pVVar6 = pvVar3[1].items;
        pvVar3[1].size_active = sVar4 + 1;
        *(ulong *)&pVVar6[sVar4].field_0 = CONCAT44(iVar14 + 0x47502932,iVar11 + 0x3c6ef35f);
        *(ulong *)((long)&pVVar6[sVar4].field_0 + 8) = CONCAT44(uVar10,iVar16 + -0x2e330917);
      }
      sVar18 = sVar18 + 1;
    } while (sVar18 != local_40);
  }
  pNVar9 = local_38;
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar9;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbagePointSet(int hash, size_t numPoints, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(RTC_GEOMETRY_TYPE_SPHERE_POINT, material,BBox1f(0,1),mblur?2:1);

    for (size_t i = 0; i < numPoints; i++)
    {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float r = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0].push_back(Vec3ff(x, y, z, r));

      if (mblur)
      {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float r = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1].push_back(Vec3ff(x, y, z, r));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }